

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_printer.h
# Opt level: O2

void Fantasy_Character_print_json_union_type(flatcc_json_printer_t *ctx,flatbuffers_utype_t type)

{
  int iVar1;
  undefined7 in_register_00000031;
  char *symbol;
  size_t sStack_8;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 2:
    symbol = "MuLan";
    break;
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    goto switchD_001123cb_caseD_3;
  case 8:
    symbol = "Rapunzel";
    sStack_8 = 8;
    goto LAB_0011241c;
  case 9:
    symbol = "Belle";
    break;
  case 10:
    symbol = "BookFan";
    sStack_8 = 7;
    goto LAB_0011241c;
  case 0xb:
    symbol = "Other";
    break;
  default:
    if (iVar1 == 0xff) {
      symbol = "Unused";
      sStack_8 = 6;
      goto LAB_0011241c;
    }
    goto switchD_001123cb_caseD_3;
  }
  sStack_8 = 5;
LAB_0011241c:
  flatcc_json_printer_enum(ctx,symbol,sStack_8);
  return;
switchD_001123cb_caseD_3:
  symbol = "NONE";
  sStack_8 = 4;
  goto LAB_0011241c;
}

Assistant:

static void Fantasy_Character_print_json_union_type(flatcc_json_printer_t *ctx, flatbuffers_utype_t type)
{
    switch (type) {
    case 2:
        flatcc_json_printer_enum(ctx, "MuLan", 5);
        break;
    case 8:
        flatcc_json_printer_enum(ctx, "Rapunzel", 8);
        break;
    case 9:
        flatcc_json_printer_enum(ctx, "Belle", 5);
        break;
    case 10:
        flatcc_json_printer_enum(ctx, "BookFan", 7);
        break;
    case 11:
        flatcc_json_printer_enum(ctx, "Other", 5);
        break;
    case 255:
        flatcc_json_printer_enum(ctx, "Unused", 6);
        break;
    default:
        flatcc_json_printer_enum(ctx, "NONE", 4);
        break;
    }
}